

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

void cvFreeVectors(CVodeMem cv_mem)

{
  int iVar1;
  long in_RDI;
  int maxord;
  int j;
  undefined4 local_c;
  
  iVar1 = *(int *)(in_RDI + 0x460);
  N_VDestroy(*(undefined8 *)(in_RDI + 200));
  N_VDestroy(*(undefined8 *)(in_RDI + 0xd8));
  N_VDestroy(*(undefined8 *)(in_RDI + 0xe0));
  N_VDestroy(*(undefined8 *)(in_RDI + 0xe8));
  N_VDestroy(*(undefined8 *)(in_RDI + 0xf0));
  N_VDestroy(*(undefined8 *)(in_RDI + 0xf8));
  N_VDestroy(*(undefined8 *)(in_RDI + 0x100));
  for (local_c = 0; local_c <= iVar1; local_c = local_c + 1) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x60 + (long)local_c * 8));
  }
  *(long *)(in_RDI + 0x3c0) =
       *(long *)(in_RDI + 0x3c0) - (long)(iVar1 + 8) * *(long *)(in_RDI + 0x3b0);
  *(long *)(in_RDI + 0x3c8) =
       *(long *)(in_RDI + 0x3c8) - (long)(iVar1 + 8) * *(long *)(in_RDI + 0x3b8);
  if (*(int *)(in_RDI + 0x468) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x38));
    *(long *)(in_RDI + 0x3c0) = *(long *)(in_RDI + 0x3c0) - *(long *)(in_RDI + 0x3b0);
    *(long *)(in_RDI + 0x3c8) = *(long *)(in_RDI + 0x3c8) - *(long *)(in_RDI + 0x3b8);
  }
  if (*(int *)(in_RDI + 0x470) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x108));
    *(long *)(in_RDI + 0x3c0) = *(long *)(in_RDI + 0x3c0) - *(long *)(in_RDI + 0x3b0);
    *(long *)(in_RDI + 0x3c8) = *(long *)(in_RDI + 0x3c8) - *(long *)(in_RDI + 0x3b8);
  }
  return;
}

Assistant:

static void cvFreeVectors(CVodeMem cv_mem)
{
  int j, maxord;

  maxord = cv_mem->cv_qmax_alloc;

  N_VDestroy(cv_mem->cv_ewt);
  N_VDestroy(cv_mem->cv_acor);
  N_VDestroy(cv_mem->cv_tempv);
  N_VDestroy(cv_mem->cv_ftemp);
  N_VDestroy(cv_mem->cv_vtemp1);
  N_VDestroy(cv_mem->cv_vtemp2);
  N_VDestroy(cv_mem->cv_vtemp3);
  for (j = 0; j <= maxord; j++) { N_VDestroy(cv_mem->cv_zn[j]); }

  cv_mem->cv_lrw -= (maxord + 8) * cv_mem->cv_lrw1;
  cv_mem->cv_liw -= (maxord + 8) * cv_mem->cv_liw1;

  if (cv_mem->cv_VabstolMallocDone)
  {
    N_VDestroy(cv_mem->cv_Vabstol);
    cv_mem->cv_lrw -= cv_mem->cv_lrw1;
    cv_mem->cv_liw -= cv_mem->cv_liw1;
  }

  if (cv_mem->cv_constraintsMallocDone)
  {
    N_VDestroy(cv_mem->cv_constraints);
    cv_mem->cv_lrw -= cv_mem->cv_lrw1;
    cv_mem->cv_liw -= cv_mem->cv_liw1;
  }
}